

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.h
# Opt level: O1

int floatx80_compare_aarch64(floatx80 a,floatx80 b,float_status *status)

{
  ulong uVar1;
  ushort uVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  ushort uVar6;
  
  uVar4 = b.low;
  uVar5 = a.low;
  uVar6 = a.high;
  if ((long)uVar5 < 0 || ((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0)
  {
    uVar2 = b.high;
    if (((((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 ||
          (long)uVar4 < 0) &&
        (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
         (uVar6 & 0x7fff) != 0x7fff)) &&
       (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
        (uVar2 & 0x7fff) != 0x7fff)) {
      uVar1 = (a._8_8_ & 0xffff) >> 0xf;
      bVar3 = (byte)uVar1;
      if ((ushort)uVar1 == uVar2 >> 0xf) {
        if (uVar5 == uVar4 && uVar6 == uVar2) {
          return 0;
        }
        bVar3 = (uVar5 < uVar4 && uVar6 == uVar2 || uVar6 < uVar2) ^ bVar3;
      }
      else if (((b._8_4_ | a._8_4_) & 0x7fff) == 0 && (uVar4 == 0 && uVar5 == 0)) {
        return 0;
      }
      return 1 - (uint)(byte)(bVar3 * '\x02');
    }
  }
  status->float_exception_flags = status->float_exception_flags | 1;
  return 2;
}

Assistant:

static inline bool floatx80_invalid_encoding(floatx80 a)
{
    return (a.low & (1ULL << 63)) == 0 && (a.high & 0x7FFF) != 0;
}